

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

int __thiscall
absl::lts_20250127::Cord::CompareSlowPath
          (Cord *this,Cord *rhs,size_t compared_size,size_t size_to_compare)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  bool local_1a1;
  undefined1 auStack_188 [4];
  int memcmp_res;
  string_view rhs_chunk;
  string_view lhs_chunk;
  ChunkIterator rhs_it;
  ChunkIterator lhs_it;
  size_t sStack_30;
  anon_class_1_0_00000001 advance;
  size_t size_to_compare_local;
  size_t compared_size_local;
  Cord *rhs_local;
  Cord *this_local;
  
  sStack_30 = size_to_compare;
  chunk_begin((ChunkIterator *)(rhs_it.btree_reader_.navigator_.node_ + 0xb),this);
  chunk_begin((ChunkIterator *)&lhs_chunk._M_str,rhs);
  if (lhs_it.current_leaf_ == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
  }
  else {
    join_0x00000010_0x00000000_ =
         ChunkIterator::operator*((ChunkIterator *)(rhs_it.btree_reader_.navigator_.node_ + 0xb));
  }
  if (rhs_it.current_leaf_ == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188);
  }
  else {
    _auStack_188 = ChunkIterator::operator*((ChunkIterator *)&lhs_chunk._M_str);
  }
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
  if (compared_size <= sVar4) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188);
    if (sVar4 < compared_size) {
      __assert_fail("compared_size <= rhs_chunk.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                    ,0x3b7,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str,compared_size);
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188,compared_size);
    sStack_30 = sStack_30 - compared_size;
    do {
      bVar1 = CompareSlowPath::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         ((long)lhs_it.btree_reader_.navigator_.node_ + 0x5f),
                         (Nonnull<Cord::ChunkIterator_*>)
                         (rhs_it.btree_reader_.navigator_.node_ + 0xb),
                         (Nonnull<absl::string_view_*>)&rhs_chunk._M_str);
      local_1a1 = false;
      if (bVar1) {
        local_1a1 = CompareSlowPath::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)
                               ((long)lhs_it.btree_reader_.navigator_.node_ + 0x5f),
                               (Nonnull<Cord::ChunkIterator_*>)&lhs_chunk._M_str,
                               (Nonnull<absl::string_view_*>)auStack_188);
      }
      if (local_1a1 == false) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188);
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_chunk._M_str);
        return (uint)bVar1 - (uint)bVar2;
      }
      iVar3 = anon_unknown_58::CompareChunks
                        ((Nonnull<absl::string_view_*>)&rhs_chunk._M_str,
                         (Nonnull<absl::string_view_*>)auStack_188,&stack0xffffffffffffffd0);
      if (iVar3 != 0) {
        return iVar3;
      }
    } while (sStack_30 != 0);
    return 0;
  }
  __assert_fail("compared_size <= lhs_chunk.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x3b6,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
}

Assistant:

inline int Cord::CompareSlowPath(const Cord& rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](absl::Nonnull<Cord::ChunkIterator*> it,
                    absl::Nonnull<absl::string_view*> chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();
  Cord::ChunkIterator rhs_it = rhs.chunk_begin();

  // compared_size is inside both first chunks.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  absl::string_view rhs_chunk =
      (rhs_it.bytes_remaining_ != 0) ? *rhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs_chunk.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs_chunk.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && advance(&rhs_it, &rhs_chunk)) {
    int memcmp_res = CompareChunks(&lhs_chunk, &rhs_chunk, &size_to_compare);
    if (memcmp_res != 0) return memcmp_res;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs_chunk.empty()) -
         static_cast<int>(lhs_chunk.empty());
}